

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O0

Message * __thiscall testing::Message::operator<<(Message *this,wchar_t *wide_c_str)

{
  Message *pMVar1;
  wchar_t *in_RDI;
  String *this_00;
  String *in_stack_ffffffffffffffc8;
  Message *in_stack_ffffffffffffffd0;
  String local_20;
  
  this_00 = &local_20;
  internal::String::ShowWideCString(in_RDI);
  pMVar1 = operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  internal::String::~String(this_00);
  return pMVar1;
}

Assistant:

Message& operator <<(const wchar_t* wide_c_str) {
    return *this << internal::String::ShowWideCString(wide_c_str);
  }